

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CHog.h
# Opt level: O1

void __thiscall CHog::calcDiff(CHog *this,uchar *image,double **magnitudeTable)

{
  uint uVar1;
  double dVar2;
  byte bVar3;
  byte bVar4;
  int **ppiVar5;
  int **ppiVar6;
  int *piVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  long local_60;
  
  if (0 < this->imgHeight) {
    ppiVar5 = this->dx;
    ppiVar6 = this->dy;
    local_60 = 0;
    iVar18 = 0;
    do {
      uVar14 = (ulong)(uint)this->imgWidth;
      if (0 < this->imgWidth) {
        piVar7 = ppiVar5[local_60];
        iVar9 = (int)local_60;
        piVar8 = ppiVar6[local_60];
        lVar11 = 0;
        do {
          iVar10 = (int)lVar11;
          iVar13 = (int)uVar14;
          iVar15 = this->widthStep * iVar9 + iVar18;
          lVar12 = lVar11 + 1;
          piVar7[lVar11] =
               (uint)image[((iVar10 + -1 + iVar13) % iVar13) * this->imgChannel + iVar15] -
               (uint)image[(((int)lVar12 + iVar13) % iVar13) * this->imgChannel + iVar15];
          iVar13 = this->imgHeight;
          iVar18 = this->imgChannel * iVar10 + iVar18;
          bVar3 = image[((iVar13 + iVar9 + -1) % iVar13) * this->widthStep + iVar18];
          bVar4 = image[((iVar13 + iVar9 + 1) % iVar13) * this->widthStep + iVar18];
          piVar8[lVar11] = (int)((ulong)bVar3 - (ulong)bVar4);
          iVar13 = this->imgChannel;
          iVar18 = 1;
          if (1 < iVar13) {
            dVar2 = magnitudeTable[((ulong)bVar3 - (ulong)bVar4) + 0xff]
                    [(long)piVar7[lVar11] + 0xff];
            do {
              iVar15 = this->imgHeight;
              iVar16 = this->widthStep;
              iVar17 = iVar10 * iVar13 + iVar18;
              bVar3 = image[((iVar15 + iVar9 + -1) % iVar15) * iVar16 + iVar17];
              bVar4 = image[((iVar15 + iVar9 + 1) % iVar15) * iVar16 + iVar17];
              uVar1 = ((uint)bVar3 - (uint)bVar4) + 0xff;
              if ((double)(int)dVar2 < magnitudeTable[uVar1][uVar1]) {
                iVar15 = this->imgWidth;
                iVar16 = iVar16 * iVar9 + iVar18;
                piVar7[lVar11] =
                     (uint)image[((iVar10 + -1 + iVar15) % iVar15) * iVar13 + iVar16] -
                     (uint)image[((iVar15 + (int)lVar12) % iVar15) * iVar13 + iVar16];
                piVar8[lVar11] = (uint)bVar3 - (uint)bVar4;
              }
              iVar18 = iVar18 + 1;
              iVar13 = this->imgChannel;
            } while (iVar18 < iVar13);
          }
          uVar14 = (ulong)this->imgWidth;
          lVar11 = lVar12;
        } while (lVar12 < (long)uVar14);
      }
      local_60 = local_60 + 1;
    } while (local_60 < this->imgHeight);
  }
  return;
}

Assistant:

void CHog::calcDiff(unsigned char* image, double** magnitudeTable) //图像数据
{
    int x=0, y=0, c=0;
    int xDiffs, yDiffs, magni;
    //cout<<"calculating differential"<<endl;
    //遍历图像//
    for(y=0; y<imgHeight; y++)
    {
        for(x=0; x<imgWidth; x++)
        {
            dx[y][x] = (int)image[y*widthStep+((x-1+imgWidth)%imgWidth)*imgChannel+c] - (int)image[y*widthStep+((x+1+imgWidth)%imgWidth)*imgChannel+c]; //x方向梯度
            dy[y][x] = (int)image[(y-1+imgHeight)%imgHeight*widthStep+x*imgChannel+c] - (int)image[(y+1+imgHeight)%imgHeight*widthStep+x*imgChannel+c]; //y方向梯度
            magni = magnitudeTable[dy[y][x]+255][dx[y][x]+255];
            for(c=1; c<imgChannel; c++)
            {
                xDiffs = (int)image[y*widthStep+((x-1+imgWidth)%imgWidth)*imgChannel+c] - (int)image[y*widthStep+((x+1+imgWidth)%imgWidth)*imgChannel+c]; //x方向梯度
                yDiffs = (int)image[(y-1+imgHeight)%imgHeight*widthStep+x*imgChannel+c] - (int)image[(y+1+imgHeight)%imgHeight*widthStep+x*imgChannel+c]; //y方向梯度
                if(magni < magnitudeTable[yDiffs+255][yDiffs+255])
                {
                    dx[y][x] = xDiffs;
                    dy[y][x] = yDiffs;
                }
            }

        }
    }
    //cout<<"differential calculated\t"<<endl;
}